

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

longdouble * __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
::local_compute_reduced_cost<baryonyx::bit_array>
          (longdouble *__return_storage_ptr__,
          solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
          *this,int variable,bit_array *x)

{
  longdouble lVar1;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar2;
  bit_array *x_00;
  type plVar3;
  longdouble *plVar4;
  undefined4 in_register_00000014;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble a;
  type *hte;
  type *ht;
  undefined1 auStack_38 [8];
  longdouble sum_a_pi_p;
  undefined8 local_20;
  bit_array *x_local;
  longdouble *plStack_10;
  int variable_local;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  *this_local;
  
  local_20._4_4_ = in_register_00000014;
  local_20._0_4_ = variable;
  x_local._4_4_ = (uint)this;
  _auStack_38 = (longdouble)0;
  plStack_10 = __return_storage_ptr__;
  sparse_matrix<int>::column((sparse_matrix<int> *)&ht,(int)__return_storage_ptr__ + 0x10);
  ppcVar2 = std::
            get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                      ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                        *)&ht);
  x_00 = (bit_array *)
         std::
         get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                   ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                     *)&ht);
  while (*ppcVar2 !=
         *(__tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *)&x_00->super_bit_array_impl) {
    this_00 = (unique_ptr<int[],_std::default_delete<int[]>_> *)
              ((long)__return_storage_ptr__ + 0x58);
    std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](this_00,(long)(*ppcVar2)->value)
    ;
    std::abs((int)this_00);
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        ((long)__return_storage_ptr__ + 0x78),(long)(*ppcVar2)->row);
    lVar1 = *plVar3;
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (__return_storage_ptr__ + 5),(long)(*ppcVar2)->value);
    _auStack_38 = _auStack_38 + in_ST0 * (*plVar3 + lVar1);
    *ppcVar2 = *ppcVar2 + 1;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
  }
  plVar4 = default_cost_type<long_double>::operator()
                     (*(longdouble **)((long)__return_storage_ptr__ + 0x178),
                      (default_cost_type<long_double> *)(ulong)x_local._4_4_,(size_type)local_20,
                      x_00);
  return plVar4;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }